

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O2

void __thiscall
kstream<gzFile_s_*,_FunctorZlib>::getQual(kstream<gzFile_s_*,_FunctorZlib> *this,kseq *seq)

{
  int iVar1;
  FILE *__stream;
  
  __stream = (FILE *)seq;
  while( true ) {
    iVar1 = getc(this,__stream);
    this->c = iVar1;
    if ((iVar1 == -1) || ((seq->seq)._M_string_length <= (seq->qual)._M_string_length)) break;
    if (iVar1 - 0x21U < 0x5f) {
      __stream = (FILE *)(ulong)(uint)(int)(char)iVar1;
      std::__cxx11::string::push_back((char)seq + '`');
    }
  }
  return;
}

Assistant:

void getQual(kseq& seq){
        while ((c = this->getc()) != -1 && seq.qual.length() < seq.seq.length()) {
            if (c >= 33 && c <= 127)
                seq.qual += (char)c;
        }
    }